

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.cc
# Opt level: O0

string * __thiscall
phosg::base64_decode_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *vdata,size_t size,char *alphabet)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  invalid_argument *piVar5;
  byte *pbVar6;
  reference pvVar7;
  uint8_t c4;
  uint8_t c3;
  uint8_t c2;
  ulong uStack_78;
  uint8_t c1;
  size_t offset;
  size_t end_offset;
  undefined1 local_60 [6];
  uint8_t x;
  string inverse_alphabet;
  uint8_t *data;
  char *alphabet_local;
  size_t size_local;
  void *vdata_local;
  string *ret;
  
  data = (uint8_t *)size;
  if (size == 0) {
    data = DEFAULT_ALPHABET;
  }
  if (((ulong)vdata & 3) != 0) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(piVar5,"size must be a multiple of 4 bytes");
    __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,0x100,-1,(allocator<char> *)((long)&end_offset + 7));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&end_offset + 7));
  for (end_offset._6_1_ = 0; bVar1 = end_offset._6_1_, end_offset._6_1_ < 0x40;
      end_offset._6_1_ = end_offset._6_1_ + 1) {
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,(long)(char)data[end_offset._6_1_]);
    *pbVar6 = bVar1;
  }
  pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                      0x3d);
  *pvVar7 = -0x80;
  end_offset._5_1_ = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  uStack_78 = 0;
  do {
    if (((ulong)vdata & 0xfffffffffffffffc) <= uStack_78) {
      end_offset._5_1_ = 1;
      ::std::__cxx11::string::~string((string *)local_60);
      return __return_storage_ptr__;
    }
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,(ulong)(byte)this[uStack_78]);
    bVar1 = *pbVar6;
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,(ulong)(byte)this[uStack_78 + 1]);
    bVar2 = *pbVar6;
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,(ulong)(byte)this[uStack_78 + 2]);
    bVar3 = *pbVar6;
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,(ulong)(byte)this[uStack_78 + 3]);
    bVar4 = *pbVar6;
    if (bVar4 == 0x80) {
      if (uStack_78 != ((ulong)vdata & 0xfffffffffffffffc) - 4) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::invalid_argument::invalid_argument(piVar5,"string contains padding not at the end");
        __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      if (bVar3 == 0x80) {
        if ((0x3f < bVar1) || (0x3f < bVar2)) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(piVar5,"string contains non-base64 characters");
          __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(bVar2 >> 4 & 3) + bVar1 * '\x04');
      }
      else {
        if (((0x3f < bVar1) || (0x3f < bVar2)) || (0x3f < bVar2)) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(piVar5,"string contains non-base64 characters");
          __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(bVar2 >> 4 & 3) + bVar1 * '\x04');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,bVar2 << 4 | bVar3 >> 2 & 0xf);
      }
    }
    else {
      if ((((0x3f < bVar1) || (0x3f < bVar2)) || (0x3f < bVar3)) || (0x3f < bVar4)) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::invalid_argument::invalid_argument(piVar5,"string contains non-base64 characters");
        __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,(bVar2 >> 4 & 3) + bVar1 * '\x04');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,bVar2 << 4 | bVar3 >> 2 & 0xf);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,bVar3 << 6 | bVar4);
    }
    uStack_78 = uStack_78 + 4;
  } while( true );
}

Assistant:

string base64_decode(const void* vdata, size_t size, const char* alphabet) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);

  if (!alphabet) {
    alphabet = DEFAULT_ALPHABET;
  }

  // the length must be a multiple of 4
  if (size & 3) {
    throw invalid_argument("size must be a multiple of 4 bytes");
  }

  // compute the inverse alphabet for easier decoding
  // TODO: make this not happen every time, at least for the default alphabets
  string inverse_alphabet(0x100, -1);
  for (uint8_t x = 0; x < 0x40; x++) {
    inverse_alphabet[alphabet[x]] = static_cast<char>(x);
  }
  inverse_alphabet['='] = -0x80;

  // decode blocks of 4 bytes first
  string ret;
  size_t end_offset = size & (~3);
  for (size_t offset = 0; offset < end_offset; offset += 4) {
    // aaaaaabb bbbbcccc ccdddddd
    uint8_t c1 = inverse_alphabet[data[offset]];
    uint8_t c2 = inverse_alphabet[data[offset + 1]];
    uint8_t c3 = inverse_alphabet[data[offset + 2]];
    uint8_t c4 = inverse_alphabet[data[offset + 3]];

    // TODO: this is pretty ugly; clean it up
    if (c4 == 0x80) {
      if (offset != end_offset - 4) {
        throw invalid_argument("string contains padding not at the end");
      }
      if (c3 == 0x80) {
        if ((c1 >= 0x40) || (c2 >= 0x40)) {
          throw invalid_argument("string contains non-base64 characters");
        }
        ret.push_back(((c1 << 2) & 0xFC) | ((c2 >> 4) & 0x03));
      } else {
        if ((c1 >= 0x40) || (c2 >= 0x40) || (c2 >= 0x40)) {
          throw invalid_argument("string contains non-base64 characters");
        }
        ret.push_back(((c1 << 2) & 0xFC) | ((c2 >> 4) & 0x03));
        ret.push_back(((c2 << 4) & 0xF0) | ((c3 >> 2) & 0x0F));
      }
    } else {
      if ((c1 >= 0x40) || (c2 >= 0x40) || (c3 >= 0x40) || (c4 >= 0x40)) {
        throw invalid_argument("string contains non-base64 characters");
      }
      ret.push_back((c1 << 2) | ((c2 >> 4) & 0x03));
      ret.push_back((c2 << 4) | ((c3 >> 2) & 0x0F));
      ret.push_back((c3 << 6) | c4);
    }
  }

  return ret;
}